

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void anon_unknown.dwarf_1002::sp
               (Array2D<Imf_2_5::Rgba> *px,int w,int h,float xc,float yc,float rc,float rd,float gn,
               float bl,float lm)

{
  Rgba *pRVar1;
  unsigned_short uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar8 = floorf(yc - rc);
  fVar12 = 0.0;
  if (0.0 <= fVar8) {
    fVar12 = fVar8;
  }
  fVar9 = ceilf(yc + rc);
  fVar8 = (float)h + -1.0;
  if (fVar9 <= (float)h + -1.0) {
    fVar8 = fVar9;
  }
  if ((int)fVar12 <= (int)fVar8) {
    fVar10 = ceilf(xc + rc);
    fVar9 = (float)w + -1.0;
    if (fVar10 <= (float)w + -1.0) {
      fVar9 = fVar10;
    }
    fVar11 = floorf(xc - rc);
    fVar10 = 0.0;
    if (0.0 <= fVar11) {
      fVar10 = fVar11;
    }
    lVar5 = (long)(int)fVar12;
    do {
      if ((int)fVar10 <= (int)fVar9) {
        fVar12 = ((float)(int)lVar5 - yc) / rc;
        lVar6 = (long)(int)fVar10;
        do {
          fVar11 = ((float)(int)lVar6 - xc) / rc;
          fVar15 = SQRT(fVar11 * fVar11 + fVar12 * fVar12);
          if (fVar15 < 1.0) {
            fVar13 = 1.0 - fVar15 * fVar15;
            if (fVar13 < 0.0) {
              fVar13 = sqrtf(fVar13);
            }
            else {
              fVar13 = SQRT(fVar13);
            }
            fVar11 = fVar13 * 0.7071 + fVar11 * 0.42426 + fVar12 * -0.56568;
            fVar14 = (float)(-(uint)(fVar11 < 0.0) & (uint)(fVar11 * -0.1) |
                            ~-(uint)(fVar11 < 0.0) & (uint)fVar11);
            uVar3 = 0x32;
            fVar13 = 1.0;
            fVar11 = fVar14;
            do {
              if ((uVar3 & 1) != 0) {
                fVar13 = fVar13 * fVar11;
              }
              fVar11 = fVar11 * fVar11;
              uVar7 = (uint)uVar3;
              uVar3 = uVar3 >> 1;
            } while (1 < uVar7);
            uVar7 = -(uint)(rc + -1.0 < fVar15 * rc);
            fVar11 = (float)(~uVar7 & 0x3f800000 | (uint)(rc - fVar15 * rc) & uVar7);
            fVar14 = fVar14 + fVar13 * 4.0;
            lVar4 = px->_sizeY * lVar5;
            pRVar1 = px->_data;
            fVar13 = 1.0 - fVar11;
            fVar15 = half::_toFloat[pRVar1[lVar4 + lVar6].r._h].f * fVar13 +
                     fVar14 * rd * lm * fVar11;
            if ((fVar15 != 0.0) || (NAN(fVar15))) {
              if (half::_eLut[(uint)fVar15 >> 0x17] == 0) {
                uVar2 = half::convert((int)fVar15);
              }
              else {
                uVar2 = half::_eLut[(uint)fVar15 >> 0x17] +
                        (short)(((uint)fVar15 & 0x7fffff) + 0xfff +
                                (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar2 = (unsigned_short)((uint)fVar15 >> 0x10);
            }
            pRVar1[lVar4 + lVar6].r._h = uVar2;
            fVar15 = half::_toFloat[pRVar1[lVar4 + lVar6].g._h].f * fVar13 +
                     fVar14 * gn * lm * fVar11;
            if ((fVar15 != 0.0) || (NAN(fVar15))) {
              if (half::_eLut[(uint)fVar15 >> 0x17] == 0) {
                uVar2 = half::convert((int)fVar15);
              }
              else {
                uVar2 = half::_eLut[(uint)fVar15 >> 0x17] +
                        (short)(((uint)fVar15 & 0x7fffff) + 0xfff +
                                (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar2 = (unsigned_short)((uint)fVar15 >> 0x10);
            }
            pRVar1[lVar4 + lVar6].g._h = uVar2;
            fVar11 = half::_toFloat[pRVar1[lVar4 + lVar6].b._h].f * fVar13 +
                     fVar11 * fVar14 * bl * lm;
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              if (half::_eLut[(uint)fVar11 >> 0x17] == 0) {
                uVar2 = half::convert((int)fVar11);
              }
              else {
                uVar2 = half::_eLut[(uint)fVar11 >> 0x17] +
                        (short)(((uint)fVar11 & 0x7fffff) + 0xfff +
                                (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar2 = (unsigned_short)((uint)fVar11 >> 0x10);
            }
            pRVar1[lVar4 + lVar6].b._h = uVar2;
            fVar11 = 1.0 - (1.0 - half::_toFloat[pRVar1[lVar4 + lVar6].a._h].f) * fVar13;
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              if (half::_eLut[(uint)fVar11 >> 0x17] == 0) {
                uVar2 = half::convert((int)fVar11);
              }
              else {
                uVar2 = half::_eLut[(uint)fVar11 >> 0x17] +
                        (short)(((uint)fVar11 & 0x7fffff) + 0xfff +
                                (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar2 = (unsigned_short)((uint)fVar11 >> 0x10);
            }
            pRVar1[lVar4 + lVar6].a._h = uVar2;
          }
          lVar6 = lVar6 + 1;
        } while ((int)fVar9 + 1 != (int)lVar6);
      }
      lVar5 = lVar5 + 1;
    } while ((int)fVar8 + 1 != (int)lVar5);
  }
  return;
}

Assistant:

void
sp (Array2D<Rgba> &px, int w, int h,
    float xc, float yc, float rc,
    float rd, float gn, float bl, float lm)
{
    int x1 = int (max ((float) floor (xc - rc),  0.0f));
    int x2 = int (min ((float) ceil  (xc + rc), w - 1.0f));
    int y1 = int (max ((float) floor (yc - rc),  0.0f));
    int y2 = int (min ((float) ceil  (yc + rc), h - 1.0f));

    for (int y = y1; y <= y2; ++y)
    {
	for (int x = x1; x <= x2; ++x)
	{
	    float xl = (x - xc) / rc;
	    float yl = (y - yc) / rc;
	    float r  = sqrt (xl * xl + yl * yl);

	    if (r >= 1)
		continue;

	    float a = 1;

	    if (r * rc > rc - 1)
		a = rc - r * rc;

	    float zl = sqrt (1 - r * r);
	    float dl = xl * 0.42426 - yl * 0.56568 + zl * 0.70710;

	    if (dl < 0)
		dl *= -0.1;

	    float hl = pw (dl, 50) * 4;
	    float dr = (dl + hl) * rd;
	    float dg = (dl + hl) * gn;
	    float db = (dl + hl) * bl;

	    Rgba &p = px[y][x];
	    p.r = p.r * (1 - a) + dr * lm * a;
	    p.g = p.g * (1 - a) + dg * lm * a;
	    p.b = p.b * (1 - a) + db * lm * a;
	    p.a = 1 - (1 - p.a) * (1 - a);
	}
    }
}